

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

void __thiscall
QToolBarAreaLayoutInfo::insertItem(QToolBarAreaLayoutInfo *this,QToolBar *before,QLayoutItem *item)

{
  pointer pQVar1;
  QToolBar *pQVar2;
  iterator iVar3;
  long lVar4;
  ulong uVar5;
  ulong i;
  long in_FS_OFFSET;
  undefined1 local_68 [24];
  QArrayData *local_50;
  QToolBarAreaLayoutItem *pQStack_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->lines).d.size;
  if (before == (QToolBar *)0x0) {
    if (lVar4 == 0) {
      local_68._16_4_ = this->o;
      local_68._0_8_ = (QLayoutItem *)0x0;
      local_68._8_4_ = -1;
      local_68._12_4_ = -1;
      local_50 = (QArrayData *)0x0;
      pQStack_48 = (QToolBarAreaLayoutItem *)0x0;
      local_40 = 0;
      QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
                ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this,0,
                 (QToolBarAreaLayoutLine *)local_68);
      QList<QToolBarAreaLayoutLine>::end(&this->lines);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,0x18,0x10);
        }
      }
    }
    iVar3 = QList<QToolBarAreaLayoutLine>::end(&this->lines);
    local_68._8_4_ = 0;
    local_68._12_4_ = -1;
    local_68._16_4_ = 0xffffffff;
    local_68[0x14] = false;
    local_68._0_8_ = item;
    QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem>
              ((QPodArrayOps<QToolBarAreaLayoutItem> *)&iVar3.i[-1].toolBarItems,
               iVar3.i[-1].toolBarItems.d.size,(QToolBarAreaLayoutItem *)local_68);
    QList<QToolBarAreaLayoutItem>::end(&iVar3.i[-1].toolBarItems);
  }
  else if (lVar4 != 0) {
    uVar5 = 0;
    do {
      pQVar1 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      if (pQVar1[uVar5].toolBarItems.d.size != 0) {
        lVar4 = 0;
        i = 0;
        do {
          pQVar2 = (QToolBar *)
                   (**(code **)(**(long **)((long)&(pQVar1[uVar5].toolBarItems.d.ptr)->widgetItem +
                                           lVar4) + 0x68))();
          if (pQVar2 == before) {
            local_68._8_4_ = 0;
            local_68._12_4_ = -1;
            local_68._16_4_ = 0xffffffff;
            local_68[0x14] = false;
            local_68._0_8_ = item;
            QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem>
                      ((QPodArrayOps<QToolBarAreaLayoutItem> *)&pQVar1[uVar5].toolBarItems,i,
                       (QToolBarAreaLayoutItem *)local_68);
            QList<QToolBarAreaLayoutItem>::begin(&pQVar1[uVar5].toolBarItems);
            goto LAB_004afbe9;
          }
          i = i + 1;
          lVar4 = lVar4 + 0x18;
        } while (i < (ulong)pQVar1[uVar5].toolBarItems.d.size);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(this->lines).d.size);
  }
LAB_004afbe9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::insertItem(QToolBar *before, QLayoutItem *item)
{
    if (before == nullptr) {
        if (lines.isEmpty())
            lines.append(QToolBarAreaLayoutLine(o));
        lines.last().toolBarItems.append(item);
        return;
    }

    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            if (line.toolBarItems.at(k).widgetItem->widget() == before) {
                line.toolBarItems.insert(k, item);
                return;
            }
        }
    }
}